

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall
Entity::Entity(Entity *this,uint8_t type_id,uint8_t pos_x,uint8_t pos_y,uint8_t pos_z)

{
  Attributes local_68;
  uint8_t local_14;
  uint8_t local_13;
  uint8_t local_12;
  uint8_t local_11;
  uint8_t pos_z_local;
  uint8_t pos_y_local;
  uint8_t pos_x_local;
  Entity *pEStack_10;
  uint8_t type_id_local;
  Entity *this_local;
  
  local_68.type_id = type_id;
  local_14 = pos_z;
  local_13 = pos_y;
  local_12 = pos_x;
  local_11 = type_id;
  pEStack_10 = this;
  Position::Position(&local_68.position,pos_x,pos_y,pos_z,false,false,false);
  local_68.orientation = '\0';
  local_68.palette = '\x01';
  local_68.speed = '\0';
  local_68.fightable = false;
  local_68.liftable = false;
  local_68.can_pass_through = false;
  local_68.appear_after_player_moved_away = false;
  local_68.gravity_immune = false;
  local_68.talkable = false;
  local_68.dialogue = '\0';
  local_68.behavior_id = 0;
  local_68.entity_to_use_tiles_from = (Entity *)0x0;
  local_68.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_68.mask_flags);
  Flag::Flag(&local_68.persistence_flag,0xff,0xff);
  local_68.flag_unknown_2_3 = false;
  local_68.flag_unknown_2_4 = false;
  local_68.flag_unknown_3_5 = false;
  Entity(this,&local_68);
  Attributes::~Attributes(&local_68);
  return;
}

Assistant:

Entity::Entity(uint8_t type_id, uint8_t pos_x, uint8_t pos_y, uint8_t pos_z) :
    Entity({ 
        .type_id = type_id,
        .position = Position(pos_x, pos_y, pos_z)
    })
{}